

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray *
QtStringBuilder::appendToByteArray<QStringBuilder<char_const(&)[7],QByteArray&>,char_const(&)[3]>
          (QByteArray *a,
          QStringBuilder<QStringBuilder<const_char_(&)[7],_QByteArray_&>,_const_char_(&)[3]> *b,
          char param_3)

{
  ArrayOptions *pAVar1;
  QByteArray *pQVar2;
  size_t __n;
  char (*pacVar3) [3];
  ulong uVar4;
  char *pcVar5;
  char cVar6;
  Data *pDVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  char *__dest;
  ulong uVar11;
  
  pDVar7 = (a->d).d;
  uVar9 = (a->d).size;
  uVar11 = uVar9 + (((b->a).b)->d).size + 8;
  if ((pDVar7 == (Data *)0x0) ||
     (1 < (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)uVar9);
    pDVar7 = (a->d).d;
    uVar9 = (a->d).size;
    uVar4 = uVar11;
    if (pDVar7 != (Data *)0x0) goto LAB_001ab3c1;
LAB_001ab3fe:
    if (uVar4 < uVar9) {
      uVar4 = uVar9;
    }
    QByteArray::reallocData((longlong)a,(AllocationOption)uVar4);
    pDVar7 = (a->d).d;
    if (pDVar7 != (Data *)0x0) {
      lVar8 = (pDVar7->super_QArrayData).alloc;
LAB_001ab421:
      if (lVar8 != 0) {
        pAVar1 = &(pDVar7->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      goto LAB_001ab42a;
    }
  }
  else {
LAB_001ab3c1:
    lVar8 = (pDVar7->super_QArrayData).alloc;
    pcVar5 = (a->d).ptr;
    lVar10 = ((ulong)((long)&pDVar7[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar8;
    if ((long)((lVar10 - uVar9) - (long)pcVar5) < (long)uVar11) {
      uVar4 = lVar8 * 2;
      if (lVar8 * 2 < (long)uVar11) {
        uVar4 = uVar11;
      }
      if ((1 < (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar10 - (long)pcVar5 < (long)uVar4)) goto LAB_001ab3fe;
      goto LAB_001ab421;
    }
LAB_001ab42a:
    if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_001ab442;
  }
  QByteArray::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_001ab442:
  __dest = (a->d).ptr + (a->d).size;
  pcVar5 = *(b->a).a;
  cVar6 = *pcVar5;
  while (cVar6 != '\0') {
    pcVar5 = pcVar5 + 1;
    *__dest = cVar6;
    __dest = __dest + 1;
    cVar6 = *pcVar5;
  }
  pQVar2 = (b->a).b;
  __n = (pQVar2->d).size;
  if (__n != 0) {
    memcpy(__dest,(pQVar2->d).ptr,__n);
  }
  pacVar3 = b->b;
  cVar6 = (*pacVar3)[0];
  if (cVar6 != '\0') {
    lVar8 = 0;
    do {
      __dest[lVar8 + __n] = cVar6;
      cVar6 = (*pacVar3)[lVar8 + 1];
      lVar8 = lVar8 + 1;
    } while (cVar6 != '\0');
  }
  QByteArray::resize((longlong)a);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}